

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>
               (uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  unsigned_short uVar2;
  uint j;
  long lVar3;
  ushort uVar4;
  size_t sVar5;
  size_t N_00;
  ulong uVar6;
  ulong uVar7;
  size_t N_01;
  uint j_1;
  uchar **ppuVar8;
  ulong uVar9;
  ulong uVar10;
  uchar **t;
  size_t N_02;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_short,_32UL> cache;
  vector_block<unsigned_char_*,_1024U> local_e8;
  vector_block<unsigned_char_*,_1024U> local_c0;
  vector_block<unsigned_char_*,_1024U> local_98;
  ushort auStack_70 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)&local_e8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar3) = 0;
    *(undefined8 *)((long)&local_e8._insertpos + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_e8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_e8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar3) = 0;
    *(undefined4 *)((long)&local_e8._left_in_block + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x78);
  uVar2 = pseudo_median<unsigned_short>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    ppuVar8 = strings;
    do {
      lVar3 = 0;
      do {
        puVar1 = ppuVar8[lVar3];
        if (puVar1 == (uchar *)0x0) goto LAB_001ae162;
        if (puVar1[depth] == '\0') {
          uVar4 = 0;
        }
        else {
          uVar4 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        auStack_70[lVar3] = uVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x20);
      lVar3 = 0;
      t = ppuVar8;
      do {
        vector_block<unsigned_char_*,_1024U>::push_back
                  (&local_e8 +
                   (ulong)(auStack_70[lVar3] == uVar2) + (ulong)(uVar2 < auStack_70[lVar3]) * 2,t);
        lVar3 = lVar3 + 1;
        t = t + 1;
      } while (lVar3 != 0x20);
      uVar9 = uVar9 + 0x20;
      ppuVar8 = ppuVar8 + 0x20;
    } while (uVar9 < (N & 0xffffffffffffffe0));
  }
  lVar3 = N - uVar9;
  if (uVar9 <= N && lVar3 != 0) {
    ppuVar8 = strings + uVar9;
    do {
      puVar1 = *ppuVar8;
      if (puVar1 == (uchar *)0x0) {
LAB_001ae162:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar4 = 0;
      }
      else {
        uVar4 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      vector_block<unsigned_char_*,_1024U>::push_back
                (&local_e8 + (ulong)(uVar4 == uVar2) + (ulong)(uVar2 < uVar4) * 2,ppuVar8);
      ppuVar8 = ppuVar8 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  uVar9 = (long)local_e8._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_e8._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_00 = uVar9 * 0x80 - (ulong)local_e8._left_in_block;
  uVar6 = (long)local_c0._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c0._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_02 = uVar6 * 0x80 - (ulong)local_c0._left_in_block;
  uVar7 = (long)local_98._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_01 = uVar7 * 0x80 - (ulong)local_98._left_in_block;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned short]"
                 );
  }
  if (uVar9 * 0x80 != (ulong)local_e8._left_in_block) {
    if (local_e8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001ae181;
    ppuVar8 = strings;
    if (8 < uVar9) {
      uVar10 = 2;
      if (2 < (ulong)((long)uVar9 >> 3)) {
        uVar10 = (long)uVar9 >> 3;
      }
      lVar3 = 0;
      do {
        memmove(ppuVar8,local_e8._index_block.
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],0x2000);
        ppuVar8 = ppuVar8 + 0x400;
        lVar3 = lVar3 + 1;
      } while (uVar10 - 1 != lVar3);
    }
    sVar5 = (long)local_e8._insertpos -
            (long)local_e8._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar5 != 0) {
      memmove(ppuVar8,local_e8._index_block.
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1],sVar5);
    }
  }
  if (uVar6 * 0x80 != (ulong)local_c0._left_in_block) {
    if (local_c0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001ae181;
    ppuVar8 = strings + N_00;
    if (8 < uVar6) {
      uVar9 = 2;
      if (2 < (ulong)((long)uVar6 >> 3)) {
        uVar9 = (long)uVar6 >> 3;
      }
      lVar3 = 0;
      do {
        memmove(ppuVar8,local_c0._index_block.
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],0x2000);
        ppuVar8 = ppuVar8 + 0x400;
        lVar3 = lVar3 + 1;
      } while (uVar9 - 1 != lVar3);
    }
    sVar5 = (long)local_c0._insertpos -
            (long)local_c0._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar5 != 0) {
      memmove(ppuVar8,local_c0._index_block.
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1],sVar5);
    }
  }
  if (uVar7 * 0x80 != (ulong)local_98._left_in_block) {
    if (local_98._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_98._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001ae181:
      __assert_fail("not v._index_block.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                    ,0x5b,
                    "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                   );
    }
    ppuVar8 = strings + N_00 + N_02;
    if (8 < uVar7) {
      uVar9 = 2;
      if (2 < (ulong)((long)uVar7 >> 3)) {
        uVar9 = (long)uVar7 >> 3;
      }
      lVar3 = 0;
      do {
        memmove(ppuVar8,local_98._index_block.
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],0x2000);
        ppuVar8 = ppuVar8 + 0x400;
        lVar3 = lVar3 + 1;
      } while (uVar9 - 1 != lVar3);
    }
    sVar5 = (long)local_98._insertpos -
            (long)local_98._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar5 != 0) {
      memmove(ppuVar8,local_98._index_block.
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1],sVar5);
    }
  }
  vector_block<unsigned_char_*,_1024U>::clear(&local_e8);
  vector_block<unsigned_char_*,_1024U>::clear(&local_c0);
  vector_block<unsigned_char_*,_1024U>::clear(&local_98);
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>(strings,N_00,depth);
  if ((char)uVar2 != '\0') {
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>
              (strings + N_00,N_02,depth + 2);
  }
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_short>
            (strings + N_00 + N_02,N_01,depth);
  lVar3 = 0x50;
  do {
    vector_block<unsigned_char_*,_1024U>::~vector_block
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&local_e8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}